

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O0

MetadataResult SetUICommand(ShellState *state,char **azArg,idx_t nArg)

{
  ulong in_RDX;
  long in_RSI;
  long in_RDI;
  idx_t i;
  string command;
  string asStackY_78 [48];
  ulong local_48;
  string local_40 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  MetadataResult local_1;
  
  if (in_RDX == 0) {
    local_1 = PRINT_USAGE;
  }
  else {
    std::__cxx11::string::string(local_40);
    for (local_48 = 1; local_48 < in_RDX; local_48 = local_48 + 1) {
      if (1 < local_48) {
        std::__cxx11::string::operator+=(local_40," ");
      }
      std::__cxx11::string::operator+=(local_40,*(char **)(in_RSI + local_48 * 8));
    }
    std::operator+(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    std::__cxx11::string::operator=((string *)(in_RDI + 0x188),asStackY_78);
    std::__cxx11::string::~string(asStackY_78);
    local_1 = SUCCESS;
    std::__cxx11::string::~string(local_40);
  }
  return local_1;
}

Assistant:

MetadataResult SetUICommand(ShellState &state, const char **azArg, idx_t nArg) {
	if (nArg < 1) {
		return MetadataResult::PRINT_USAGE;
	}
	string command;
	for (idx_t i = 1; i < nArg; i++) {
		if (i > 1) {
			command += " ";
		}
		command += azArg[i];
	}
	state.ui_command = "CALL " + command;
	return MetadataResult::SUCCESS;
}